

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::Test::HasNonfatalFailure(void)

{
  bool bVar1;
  UnitTestImpl *pUVar2;
  TestResult *this;
  
  pUVar2 = internal::GetUnitTestImpl();
  if (pUVar2->current_test_info_ == (TestInfo *)0x0) {
    if (pUVar2->current_test_case_ == (TestCase *)0x0) {
      this = &pUVar2->ad_hoc_test_result_;
    }
    else {
      this = &pUVar2->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    this = &pUVar2->current_test_info_->result_;
  }
  bVar1 = TestResult::HasNonfatalFailure(this);
  return bVar1;
}

Assistant:

bool Test::HasNonfatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->
      HasNonfatalFailure();
}